

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

_argument_lists * __thiscall
gl4cts::GPUShaderFP64Test8::getArgumentListsForVariableType
          (_argument_lists *__return_storage_ptr__,GPUShaderFP64Test8 *this,
          _variable_type *variable_type)

{
  pointer *ppp_Var1;
  _variable_type *__args;
  _variable_type _Var2;
  iterator iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  _argument_list_tree_node *p_Var7;
  long lVar8;
  ulong uVar9;
  _argument_list_tree_nodes leaf_nodes;
  _argument_list_tree_node *current_node_ptr;
  _argument_lists *result;
  _argument_list_tree_node_queue nodes_queue;
  _argument_list_tree_node *local_108;
  iterator iStack_100;
  _argument_list_tree_node **local_f8;
  const_iterator local_e8;
  iterator iStack_e0;
  _variable_type *local_d8;
  _argument_lists *local_d0;
  _Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  local_c8;
  int local_6c;
  _argument_list_tree_node local_68;
  
  local_d0 = __return_storage_ptr__;
  uVar4 = Utils::getNumberOfComponentsForVariableType(*variable_type);
  local_68.parent = (_argument_list_tree_node *)0x0;
  local_68.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_68.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_68.children.
  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.type = *variable_type;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::_M_initialize_map(&local_c8,0);
  local_108 = &local_68;
  std::
  deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
  ::emplace_back<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>
            ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
              *)&local_c8,&local_108);
  do {
    p_Var7 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_6c = uVar4 - p_Var7->n_components_used;
    if ((p_Var7->type < VARIABLE_TYPE_UINT) &&
       ((0x7fc03fe0U >> (p_Var7->type & VARIABLE_TYPE_UINT) & 1) != 0)) {
      lVar8 = 0;
      do {
        _Var2 = *(_variable_type *)((long)&DAT_01a88a10 + lVar8);
        local_108 = (_argument_list_tree_node *)operator_new(0x30);
        (local_108->children).
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_108->children).
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_108->children).
        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_108->n_components_used = uVar4;
        local_108->parent = p_Var7;
        local_108->type = _Var2;
        iVar3._M_current =
             (p_Var7->children).
             super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (p_Var7->children).
            super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
          ::_M_realloc_insert<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*const&>
                    ((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
                      *)p_Var7,iVar3,&local_108);
        }
        else {
          *iVar3._M_current = local_108;
          ppp_Var1 = &(p_Var7->children).
                      super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppp_Var1 = *ppp_Var1 + 1;
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x24);
    }
    if ((VARIABLE_TYPE_MAT4X3 < p_Var7->type) ||
       ((0x7fc03fe0U >> (p_Var7->type & VARIABLE_TYPE_UINT) & 1) == 0)) {
      lVar8 = 0;
      do {
        _Var2 = *(_variable_type *)((long)&DAT_01a89450 + lVar8);
        uVar5 = Utils::getNumberOfComponentsForVariableType(_Var2);
        if ((int)uVar5 <= local_6c) {
          local_108 = (_argument_list_tree_node *)operator_new(0x30);
          (local_108->children).
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_108->children).
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_108->children).
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108->n_components_used = uVar5 + p_Var7->n_components_used;
          local_108->parent = p_Var7;
          local_108->type = _Var2;
          iVar3._M_current =
               (p_Var7->children).
               super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (p_Var7->children).
              super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
            ::_M_realloc_insert<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*const&>
                      ((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
                        *)p_Var7,iVar3,&local_108);
          }
          else {
            *iVar3._M_current = local_108;
            ppp_Var1 = &(p_Var7->children).
                        super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *ppp_Var1 = *ppp_Var1 + 1;
          }
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::
            deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
            ::_M_push_back_aux<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*const&>
                      ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
                        *)&local_c8,&local_108);
          }
          else {
            *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_108;
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
    }
  } while (((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_c8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40 != 0);
  local_108 = (_argument_list_tree_node *)0x0;
  iStack_100._M_current = (_argument_list_tree_node **)0x0;
  local_f8 = (_argument_list_tree_node **)0x0;
  local_e8._M_current = (_variable_type *)&local_68;
  std::
  deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
  ::emplace_back<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>
            ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
              *)&local_c8,(_argument_list_tree_node **)&local_e8);
  do {
    local_e8._M_current = (_variable_type *)*local_c8._M_impl.super__Deque_impl_data._M_start._M_cur
    ;
    if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    uVar6 = (long)*(pointer *)(local_e8._M_current + 2) - *(undefined8 *)local_e8._M_current;
    if (uVar6 == 0) {
      if (iStack_100._M_current == local_f8) {
        std::
        vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
        ::_M_realloc_insert<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*const&>
                  ((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
                    *)&local_108,iStack_100,(_argument_list_tree_node **)&local_e8);
      }
      else {
        *iStack_100._M_current = (_argument_list_tree_node *)local_e8._M_current;
        iStack_100._M_current = iStack_100._M_current + 1;
      }
    }
    else if ((uVar6 & 0x7fffffff8) != 0) {
      uVar6 = uVar6 >> 3 & 0xffffffff;
      lVar8 = 0;
      do {
        if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
          ::_M_push_back_aux<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*const&>
                    ((deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>
                      *)&local_c8,
                     (_argument_list_tree_node **)(*(undefined8 *)local_e8._M_current + lVar8));
        }
        else {
          *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               *(_argument_list_tree_node **)(*(undefined8 *)local_e8._M_current + lVar8);
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        lVar8 = lVar8 + 8;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  } while (((long)local_c8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_c8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_c8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_c8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40 != 0);
  uVar6 = (long)iStack_100._M_current - (long)local_108;
  (local_d0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_d0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_d0->
  super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((uVar6 & 0x7fffffff8) != 0) {
    uVar9 = 0;
    do {
      local_e8._M_current = (_variable_type *)0x0;
      iStack_e0._M_current = (_variable_type *)0x0;
      local_d8 = (_variable_type *)0x0;
      p_Var7 = (_argument_list_tree_node *)
               (&(local_108->children).
                 super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)[uVar9];
      do {
        if (p_Var7 != &local_68) {
          __args = &p_Var7->type;
          if (iStack_e0._M_current == local_e8._M_current) {
            if (iStack_e0._M_current == local_d8) {
              std::
              vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>::
              _M_realloc_insert<gl4cts::Utils::_variable_type_const&>
                        ((vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>
                          *)&local_e8,iStack_e0,__args);
            }
            else {
              *iStack_e0._M_current = *__args;
              iStack_e0._M_current = iStack_e0._M_current + 1;
            }
          }
          else {
            std::
            vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
            insert((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                    *)&local_e8,local_e8,__args);
          }
        }
        p_Var7 = p_Var7->parent;
      } while (p_Var7 != (_argument_list_tree_node *)0x0);
      std::
      vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
      ::push_back(local_d0,(value_type *)&local_e8);
      if ((_argument_list_tree_node *)local_e8._M_current != (_argument_list_tree_node *)0x0) {
        operator_delete(local_e8._M_current,(long)local_d8 - (long)local_e8._M_current);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar6 >> 3 & 0xffffffff));
  }
  if (local_108 != (_argument_list_tree_node *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  std::
  _Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::~_Deque_base(&local_c8);
  _argument_list_tree_node::~_argument_list_tree_node(&local_68);
  return local_d0;
}

Assistant:

GPUShaderFP64Test8::_argument_lists GPUShaderFP64Test8::getArgumentListsForVariableType(
	const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type matrix_types[] = {
		Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3, Utils::VARIABLE_TYPE_DMAT2X4,
		Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
		Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2, Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const Utils::_variable_type scalar_types[] = { Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_DVEC2,
												   Utils::VARIABLE_TYPE_DVEC3, Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_matrix_types	 = sizeof(matrix_types) / sizeof(matrix_types[0]);
	const unsigned int n_scalar_types	 = sizeof(scalar_types) / sizeof(scalar_types[0]);
	const int		   n_total_components = (int)Utils::getNumberOfComponentsForVariableType(variable_type);

	/* Construct the argument list tree root. Each node carries a counter that tells how many components
	 * have already been assigned. Nodes that eat up all components are considered leaves and do not have
	 * any children. Otherwise, each node is assigned as many children, as there are types that could be
	 * used to define a subsequent argument, and its counter is increased by the amount of components
	 * described by the type.
	 */
	_argument_list_tree_node root;

	root.n_components_used = 0;
	root.parent			   = NULL;
	root.type			   = variable_type;

	/* Fill till all leaves use up all available components */
	_argument_list_tree_node_queue nodes_queue;

	nodes_queue.push(&root);

	do
	{
		/* Pop the first item in the queue */
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		/* Matrix variable types can be defined by a combination of non-matrix variable types OR
		 * a single matrix variable type.
		 *
		 * Let's handle the latter case first.
		 */
		const int n_components_remaining = n_total_components - current_node_ptr->n_components_used;

		if (Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known matrix types. All the types can be used
			 * as a constructor, assuming only one value is used to define new matrix's
			 * contents. */
			for (unsigned int n_matrix_type = 0; n_matrix_type < n_matrix_types; ++n_matrix_type)
			{
				Utils::_variable_type new_argument_type = matrix_types[n_matrix_type];

				/* Construct a new child node. Since GLSL spec clearly states we must not use more
				 * than one constructor argument if the only argument is a matrix type, mark the node
				 * as if it defined all available components.
				 */
				_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

				new_subnode->n_components_used = n_total_components;
				new_subnode->parent			   = current_node_ptr;
				new_subnode->type			   = new_argument_type;

				/* Add the descriptor to node list but do not add it to the queue. This would be
				 * a redundant operation, since no new children nodes would have been assigned to
				 * this node anyway.
				 */
				current_node_ptr->children.push_back(new_subnode);
			} /* for (all matrix types) */
		}	 /* if (current node's type is a matrix) */

		/* Now for a combination of non-matrix variable types.. */
		if (!Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known scalar types */
			for (unsigned int n_scalar_type = 0; n_scalar_type < n_scalar_types; ++n_scalar_type)
			{
				Utils::_variable_type new_argument_type = scalar_types[n_scalar_type];
				const int n_new_argument_components = Utils::getNumberOfComponentsForVariableType(new_argument_type);

				/* Only use the scalar type if we don't exceed the amount of components we can define
				 * for requested type.
				 */
				if (n_new_argument_components <= n_components_remaining)
				{
					/* Form new node descriptor */
					_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

					new_subnode->n_components_used = n_new_argument_components + current_node_ptr->n_components_used;
					new_subnode->parent			   = current_node_ptr;
					new_subnode->type			   = new_argument_type;

					current_node_ptr->children.push_back(new_subnode);
					nodes_queue.push(new_subnode);
				}
			} /* for (all scalar types) */
		}	 /* if (!Utils::isMatrixVariableType(current_node_ptr->type) ) */
	} while (nodes_queue.size() > 0);

	/* To construct the argument lists, traverse the tree. Each path from root to child
	 * gives us a single argument list.
	 *
	 * First, identify leaf nodes.
	 */
	_argument_list_tree_nodes leaf_nodes;

	nodes_queue.push(&root);

	do
	{
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		if (current_node_ptr->children.size() == 0)
		{
			/* This is a leaf node !*/
			leaf_nodes.push_back(current_node_ptr);
		}
		else
		{
			/* Throw all children nodes to the queue */
			const unsigned int n_children_nodes = (const unsigned int)current_node_ptr->children.size();

			for (unsigned int n_children_node = 0; n_children_node < n_children_nodes; ++n_children_node)
			{
				nodes_queue.push(current_node_ptr->children[n_children_node]);
			} /* for (all children nodes) */
		}
	} while (nodes_queue.size() > 0);

	/* For all leaf nodes, move up the tree and construct the argument lists. */
	const unsigned int n_leaf_nodes = (const unsigned int)leaf_nodes.size();
	_argument_lists	result;

	for (unsigned int n_leaf_node = 0; n_leaf_node < n_leaf_nodes; ++n_leaf_node)
	{
		_argument_list			  argument_list;
		_argument_list_tree_node* current_node_ptr = leaf_nodes[n_leaf_node];

		do
		{
			if (current_node_ptr != &root)
			{
				if (argument_list.size() == 0)
				{
					argument_list.push_back(current_node_ptr->type);
				}
				else
				{
					argument_list.insert(argument_list.begin(), current_node_ptr->type);
				}
			}

			current_node_ptr = current_node_ptr->parent;
		} while (current_node_ptr != NULL);

		result.push_back(argument_list);
	} /* for (all leaf nodes) */

	return result;
}